

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall Node::Dump(Node *this,char *prefix)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  TimeStamp TVar4;
  char *pcVar5;
  Edge *pEVar6;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar7;
  reference ppEVar8;
  char *local_68;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_38;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_30;
  const_iterator e_1;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_20;
  const_iterator e;
  char *prefix_local;
  Node *this_local;
  
  e._M_current = (Edge **)prefix;
  path_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::c_str();
  TVar4 = mtime(this);
  bVar1 = exists(this);
  pcVar5 = " (:missing)";
  if (bVar1) {
    pcVar5 = "";
  }
  bVar1 = dirty(this);
  if (bVar1) {
    local_68 = " dirty";
  }
  else {
    local_68 = " clean";
  }
  printf("%s <%s 0x%p> mtime: %ld%s, (:%s), ",prefix,uVar3,this,TVar4,pcVar5,local_68);
  pEVar6 = in_edge(this);
  if (pEVar6 == (Edge *)0x0) {
    printf("no in-edge\n");
  }
  else {
    pEVar6 = in_edge(this);
    Edge::Dump(pEVar6,"in-edge: ");
  }
  printf(" out edges:\n");
  pvVar7 = out_edges(this);
  local_20._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar7);
  while( true ) {
    pvVar7 = out_edges(this);
    e_1 = std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar7);
    bVar2 = __gnu_cxx::operator!=(&local_20,&e_1);
    bVar1 = false;
    if (bVar2) {
      ppEVar8 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_20);
      bVar1 = *ppEVar8 != (Edge *)0x0;
    }
    if (!bVar1) break;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_20);
    Edge::Dump(*ppEVar8," +- ");
    __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
    operator++(&local_20);
  }
  pvVar7 = validation_out_edges(this);
  bVar1 = std::vector<Edge_*,_std::allocator<Edge_*>_>::empty(pvVar7);
  if (!bVar1) {
    printf(" validation out edges:\n");
    pvVar7 = validation_out_edges(this);
    local_30._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar7);
    while( true ) {
      pvVar7 = validation_out_edges(this);
      local_38._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar7);
      bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
      bVar1 = false;
      if (bVar2) {
        ppEVar8 = __gnu_cxx::
                  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_30);
        bVar1 = *ppEVar8 != (Edge *)0x0;
      }
      if (!bVar1) break;
      ppEVar8 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_30);
      Edge::Dump(*ppEVar8," +- ");
      __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_30);
    }
  }
  return;
}

Assistant:

void Node::Dump(const char* prefix) const {
  printf("%s <%s 0x%p> mtime: %" PRId64 "%s, (:%s), ",
         prefix, path().c_str(), this,
         mtime(), exists() ? "" : " (:missing)",
         dirty() ? " dirty" : " clean");
  if (in_edge()) {
    in_edge()->Dump("in-edge: ");
  } else {
    printf("no in-edge\n");
  }
  printf(" out edges:\n");
  for (vector<Edge*>::const_iterator e = out_edges().begin();
       e != out_edges().end() && *e != NULL; ++e) {
    (*e)->Dump(" +- ");
  }
  if (!validation_out_edges().empty()) {
    printf(" validation out edges:\n");
    for (std::vector<Edge*>::const_iterator e = validation_out_edges().begin();
         e != validation_out_edges().end() && *e != NULL; ++e) {
      (*e)->Dump(" +- ");
    }
  }
}